

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void duckdb::CreateSortKeyHelpers::CreateSortKey
               (Vector *input,idx_t input_count,OrderModifiers order_modifier,Vector *result)

{
  initializer_list<duckdb::OrderModifiers> __l;
  unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>_> local_70;
  OrderModifiers order_modifier_local;
  idx_t input_count_local;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
  sort_key_data;
  vector<duckdb::OrderModifiers,_true> modifiers;
  
  sort_key_data.
  super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT62(sort_key_data.
                         super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._2_6_,order_modifier);
  __l._M_len = 1;
  __l._M_array = (iterator)&sort_key_data;
  order_modifier_local = order_modifier;
  input_count_local = input_count;
  ::std::vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>::vector
            (&modifiers.
              super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>,__l,
             (allocator_type *)&local_70);
  sort_key_data.
  super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sort_key_data.
  super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sort_key_data.
  super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  make_uniq<duckdb::SortKeyVectorData,duckdb::Vector&,unsigned_long&,duckdb::OrderModifiers&>
            ((duckdb *)&local_70,input,&input_count_local,&order_modifier_local);
  ::std::
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>,std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>>
            ((vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>,std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>>>
              *)&sort_key_data,
             (unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
              *)&local_70);
  ::std::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>_>::
  ~unique_ptr(&local_70);
  CreateSortKeyInternal(&sort_key_data,&modifiers,result,input_count_local);
  ::std::
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ::~vector(&sort_key_data.
             super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
           );
  ::std::_Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>::
  ~_Vector_base((_Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_> *)
                &modifiers);
  return;
}

Assistant:

void CreateSortKeyHelpers::CreateSortKey(Vector &input, idx_t input_count, OrderModifiers order_modifier,
                                         Vector &result) {
	// prepare the sort key data
	vector<OrderModifiers> modifiers {order_modifier};
	vector<unique_ptr<SortKeyVectorData>> sort_key_data;
	sort_key_data.push_back(make_uniq<SortKeyVectorData>(input, input_count, order_modifier));

	CreateSortKeyInternal(sort_key_data, modifiers, result, input_count);
}